

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int32_t float128_to_int32_round_to_zero_arm(float128 a,float_status *status)

{
  byte bVar1;
  ushort uVar2;
  int32_t iVar3;
  ulong uVar4;
  byte bVar5;
  uint64_t aSig1;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = a.high._6_2_ & 0x7fff;
  bVar1 = a.high._7_1_;
  uVar7 = (ulong)(a.low != 0) | a.high & 0xffffffffffff;
  if (uVar2 < 0x401f) {
    if (uVar2 < 0x3fff) {
      iVar3 = 0;
      if (uVar7 == 0 &&
          ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        return 0;
      }
    }
    else {
      bVar5 = 0x2f - (char)uVar2;
      uVar8 = uVar7 + 0x1000000000000 >> (bVar5 & 0x3f);
      uVar4 = (ulong)(uint)-(int)uVar8;
      if (-1 < (long)a.high) {
        uVar4 = uVar8 & 0xffffffff;
      }
      iVar3 = (int32_t)uVar4;
      bVar6 = bVar1 >> 7;
      if ((int)(uVar4 >> 0x1f) != -(a.high._4_4_ >> 0x1f)) goto LAB_0050d5e8;
      if (uVar8 << (bVar5 & 0x3f) == uVar7 + 0x1000000000000) {
        return iVar3;
      }
    }
    status->float_exception_flags = status->float_exception_flags | 0x20;
    return iVar3;
  }
  bVar6 = 0;
  if (uVar7 == 0) {
    bVar6 = bVar1 >> 7;
  }
  if (uVar2 != 0x7fff) {
    bVar6 = bVar1 >> 7;
  }
LAB_0050d5e8:
  status->float_exception_flags = status->float_exception_flags | 1;
  return -0x80000000 - (uint)(bVar6 == 0);
}

Assistant:

int32_t float128_to_int32_round_to_zero(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1, savedASig;
    int32_t z;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    aSig0 |= ( aSig1 != 0 );
    if ( 0x401E < aExp ) {
        if ( ( aExp == 0x7FFF ) && aSig0 ) aSign = 0;
        goto invalid;
    }
    else if ( aExp < 0x3FFF ) {
        if (aExp || aSig0) {
            status->float_exception_flags |= float_flag_inexact;
        }
        return 0;
    }
    aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = 0x402F - aExp;
    savedASig = aSig0;
    aSig0 >>= shiftCount;
    z = aSig0;
    if ( aSign ) z = - z;
    if ( ( z < 0 ) ^ aSign ) {
 invalid:
        float_raise(float_flag_invalid, status);
        return aSign ? INT32_MIN : INT32_MAX;
    }
    if ( ( aSig0<<shiftCount ) != savedASig ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}